

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>::
~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
           *this)

{
  AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>
  *this_local;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>::~Tuple(&this->attachment);
  AttachmentPromiseNodeBase::~AttachmentPromiseNodeBase(&this->super_AttachmentPromiseNodeBase);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }